

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

void __thiscall MsFlash50::extra::extra(extra *this,uint8_t *p)

{
  string sStack_38;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  getstr<unsigned_char_const*>(&sStack_38,p,8);
  std::__cxx11::string::operator=((string *)this,(string *)&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  this->start = *(uint32_t *)(p + 8);
  this->size = *(uint32_t *)(p + 0xc);
  return;
}

Assistant:

extra(const uint8_t *p)
        {
            name= getstr(p, 8);

            start= get32le(p+8);
            size= get32le(p+12);
        }